

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall avro::NodeSymbolic::NodeSymbolic(NodeSymbolic *this,HasName *name,NodePtr *n)

{
  NoAttribute<boost::shared_ptr<avro::Node>_> *in_RDX;
  SingleAttribute<avro::Name> *in_RSI;
  undefined8 *in_RDI;
  NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
  *unaff_retaddr;
  NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffe0;
  
  NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
  ::NodeImpl(unaff_retaddr,(Type)((ulong)in_RDI >> 0x20),in_RSI,in_RDX,in_stack_ffffffffffffffe0,
             (NoAttribute<int> *)in_RDX);
  *in_RDI = &PTR__NodeSymbolic_0030cb78;
  boost::weak_ptr<avro::Node>::weak_ptr<avro::Node>((weak_ptr<avro::Node> *)(in_RDI + 0xb),in_RDX);
  return;
}

Assistant:

NodeSymbolic(const HasName &name, const NodePtr n) :
        NodeImplSymbolic(AVRO_SYMBOLIC, name, NoLeaves(), NoLeafNames(), NoSize()), actualNode_(n)
    { }